

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlinePass::CloneAndMapLocals
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  CommonDebugInfoInstructions CVar1;
  uint32_t to;
  uint32_t uVar2;
  DecorationManager *this_01;
  DebugInfoManager *this_02;
  mapped_type *pmVar3;
  pointer *__ptr;
  Instruction *this_03;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_48;
  uint32_t local_3c;
  DebugInlinedAtContext *local_38;
  
  this_03 = *(Instruction **)
             ((long)(((calleeFn->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t + 0x20);
  local_38 = inlined_at_ctx;
  do {
    while (this_03->opcode_ == OpVariable) {
LAB_004c9a67:
      local_48._M_head_impl = Instruction::Clone(this_03,(this->super_Pass).context_);
      to = IRContext::TakeNextId((this->super_Pass).context_);
      if (to == 0) {
        if (local_48._M_head_impl != (Instruction *)0x0) {
          (*((local_48._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            _vptr_IntrusiveNodeBase[1])();
        }
        return false;
      }
      this_01 = Pass::get_decoration_mgr(&this->super_Pass);
      uVar2 = Instruction::result_id(this_03);
      analysis::DecorationManager::CloneDecorations(this_01,uVar2,to);
      Instruction::SetResultId(local_48._M_head_impl,to);
      this_00._M_head_impl = local_48._M_head_impl;
      this_02 = IRContext::get_debug_info_mgr((this->super_Pass).context_);
      uVar2 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                        (this_02,(this_03->dbg_scope_).inlined_at_,local_38);
      Instruction::UpdateDebugInlinedAt(this_00._M_head_impl,uVar2);
      local_3c = Instruction::result_id(this_03);
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)callee2caller,&local_3c);
      *pmVar3 = to;
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)new_vars,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_48);
      this_03 = (this_03->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (local_48._M_head_impl != (Instruction *)0x0) {
        (*((local_48._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
    }
    CVar1 = Instruction::GetCommonDebugOpcode(this_03);
    if (CVar1 != CommonDebugInfoDebugDeclare) {
      return true;
    }
    if (this_03->opcode_ == OpVariable) goto LAB_004c9a67;
    this_03 = (this_03->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

bool InlinePass::CloneAndMapLocals(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars,
    std::unordered_map<uint32_t, uint32_t>* callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx) {
  auto callee_block_itr = calleeFn->begin();
  auto callee_var_itr = callee_block_itr->begin();
  while (callee_var_itr->opcode() == spv::Op::OpVariable ||
         callee_var_itr->GetCommonDebugOpcode() ==
             CommonDebugInfoDebugDeclare) {
    if (callee_var_itr->opcode() != spv::Op::OpVariable) {
      ++callee_var_itr;
      continue;
    }

    std::unique_ptr<Instruction> var_inst(callee_var_itr->Clone(context()));
    uint32_t newId = context()->TakeNextId();
    if (newId == 0) {
      return false;
    }
    get_decoration_mgr()->CloneDecorations(callee_var_itr->result_id(), newId);
    var_inst->SetResultId(newId);
    var_inst->UpdateDebugInlinedAt(
        context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
            callee_var_itr->GetDebugInlinedAt(), inlined_at_ctx));
    (*callee2caller)[callee_var_itr->result_id()] = newId;
    new_vars->push_back(std::move(var_inst));
    ++callee_var_itr;
  }
  return true;
}